

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.h
# Opt level: O1

void __thiscall
libDAI::RegionGraph::setFactors
          (RegionGraph *this,
          map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
          *facs,bool backup)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  VarSet ns;
  VarSet local_48;
  
  FactorGraph::setFactors(&this->_fg,facs,backup);
  local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._statespace = 1;
  for (p_Var1 = (facs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(facs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    VarSet::operator|=(&local_48,(VarSet *)&p_Var1[1]._M_parent);
  }
  RecomputeORs(this,&local_48);
  if (local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void setFactors( const std::map<size_t, Factor> & facs, bool backup = false ) {
                _fg.setFactors( facs, backup );
                VarSet ns;
                for( std::map<size_t, Factor>::const_iterator fac = facs.begin(); fac != facs.end(); fac++ )
                    ns |= fac->second.vars();
                RecomputeORs( ns ); 
            }